

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# in_filter.cpp
# Opt level: O1

string * __thiscall
duckdb::InFilter::ToString(string *__return_storage_ptr__,InFilter *this,string *column_name)

{
  pointer pVVar1;
  pointer pcVar2;
  long lVar3;
  string *psVar4;
  long *plVar5;
  size_type *psVar6;
  pointer this_00;
  string in_list;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  string local_a0;
  undefined1 *local_80;
  long local_78;
  undefined1 local_70 [16];
  string *local_60;
  string *local_58;
  undefined1 *local_50 [2];
  undefined1 local_40 [16];
  
  local_80 = local_70;
  local_78 = 0;
  local_70[0] = 0;
  this_00 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
            super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
            super__Vector_impl_data._M_start;
  pVVar1 = (this->values).super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  local_60 = __return_storage_ptr__;
  local_58 = column_name;
  if (this_00 != pVVar1) {
    do {
      if (local_78 != 0) {
        ::std::__cxx11::string::append((char *)&local_80);
      }
      Value::ToSQLString_abi_cxx11_(&local_a0,this_00);
      ::std::__cxx11::string::_M_append((char *)&local_80,(ulong)local_a0._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
        operator_delete(local_a0._M_dataplus._M_p);
      }
      this_00 = this_00 + 1;
    } while (this_00 != pVVar1);
  }
  pcVar2 = (local_58->_M_dataplus)._M_p;
  local_50[0] = local_40;
  ::std::__cxx11::string::_M_construct<char*>
            ((string *)local_50,pcVar2,pcVar2 + local_58->_M_string_length);
  ::std::__cxx11::string::append((char *)local_50);
  plVar5 = (long *)::std::__cxx11::string::_M_append((char *)local_50,(ulong)local_80);
  psVar4 = local_60;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar5 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar6) {
    local_a0.field_2._M_allocated_capacity = *psVar6;
    local_a0.field_2._8_8_ = plVar5[3];
    local_a0._M_dataplus._M_p = (pointer)&local_a0.field_2;
  }
  else {
    local_a0.field_2._M_allocated_capacity = *psVar6;
    local_a0._M_dataplus._M_p = (pointer)*plVar5;
  }
  local_a0._M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  plVar5 = (long *)::std::__cxx11::string::append((char *)&local_a0);
  (psVar4->_M_dataplus)._M_p = (pointer)&psVar4->field_2;
  psVar6 = (size_type *)(plVar5 + 2);
  if ((size_type *)*plVar5 == psVar6) {
    lVar3 = plVar5[3];
    (psVar4->field_2)._M_allocated_capacity = *psVar6;
    *(long *)((long)&psVar4->field_2 + 8) = lVar3;
  }
  else {
    (psVar4->_M_dataplus)._M_p = (pointer)*plVar5;
    (psVar4->field_2)._M_allocated_capacity = *psVar6;
  }
  psVar4->_M_string_length = plVar5[1];
  *plVar5 = (long)psVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_a0._M_dataplus._M_p != &local_a0.field_2) {
    operator_delete(local_a0._M_dataplus._M_p);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0]);
  }
  if (local_80 != local_70) {
    operator_delete(local_80);
  }
  return psVar4;
}

Assistant:

string InFilter::ToString(const string &column_name) const {
	string in_list;
	for (auto &val : values) {
		if (!in_list.empty()) {
			in_list += ", ";
		}
		in_list += val.ToSQLString();
	}
	return column_name + " IN (" + in_list + ")";
}